

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<1280,Blob<224>>
               (hashfunc<Blob<224>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  byte in_CL;
  byte in_DL;
  char *pcVar4;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  Blob<224> h;
  keytype k;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  undefined4 in_stack_ffffffffffffff0c;
  byte bVar5;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffff10;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffff20;
  Blob<1280> *in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff37;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  pfHash in_stack_ffffffffffffff40;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_DL & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x500,pcVar4,(ulong)in_ESI);
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)0x18402f);
  Blob<1280>::Blob((Blob<1280> *)&stack0xffffffffffffff38);
  memset(&stack0xffffffffffffff38,0,0xa0);
  if ((local_d & 1) != 0) {
    Blob<224>::Blob((Blob<224> *)&stack0xffffffffffffff10);
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(&stack0xffffffffffffff38,0xa0,0,&stack0xffffffffffffff10);
    std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::push_back
              (in_stack_ffffffffffffff10,(value_type *)CONCAT44(in_stack_ffffffffffffff0c,in_ESI));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<1280>,Blob<224>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
             (bool)in_stack_ffffffffffffff37,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  sVar3 = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  bVar5 = 1;
  bVar1 = TestHashList<Blob<224>>
                    ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)h.bytes._8_8_,
                     (bool)h.bytes[7],(bool)h.bytes[6],(bool)h.bytes[5],(bool)h.bytes[4],
                     (bool)h.bytes[3]);
  bVar5 = bVar1 & bVar5;
  printf("\n");
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::~vector(in_stack_ffffffffffffff10);
  return (bool)(bVar5 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}